

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::set_button(CImgDisplay *this,uint button,bool is_pressed)

{
  X11_static *pXVar1;
  uint local_30;
  uint local_2c;
  uint buttoncode;
  bool is_pressed_local;
  uint button_local;
  CImgDisplay *this_local;
  
  if (button == 1) {
    local_2c = 1;
  }
  else {
    if (button == 2) {
      local_30 = 2;
    }
    else {
      local_30 = 0;
      if (button == 3) {
        local_30 = 4;
      }
    }
    local_2c = local_30;
  }
  if (is_pressed) {
    this->_button = local_2c | this->_button;
  }
  else {
    this->_button = (local_2c ^ 0xffffffff) & this->_button;
  }
  this->_is_event = (bool)(-(local_2c != 0) & 1);
  if (local_2c != 0) {
    pXVar1 = cimg::X11_attr();
    pthread_cond_broadcast((pthread_cond_t *)&pXVar1->wait_event);
  }
  return this;
}

Assistant:

CImgDisplay& set_button(const unsigned int button, const bool is_pressed=true) {
      const unsigned int buttoncode = button==1U?1U:button==2U?2U:button==3U?4U:0U;
      if (is_pressed) _button |= buttoncode; else _button &= ~buttoncode;
      _is_event = buttoncode?true:false;
      if (buttoncode) {
#if cimg_display==1
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
        SetEvent(cimg::Win32_attr().wait_event);
#endif
      }
      return *this;
    }